

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

sexp_conflict sexp_load_standard_params(sexp_conflict ctx,sexp_conflict e,int nonblocking)

{
  sexp_conflict psVar1;
  sexp_conflict psVar2;
  sexp_conflict res;
  sexp_conflict local_38;
  sexp_gc_var_t local_30;
  
  local_30.var = &local_38;
  local_38 = (sexp_conflict)0x43e;
  local_30.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_30;
  sexp_load_standard_ports(ctx,e,_stdin,_stdout,_stderr,0);
  if (nonblocking != 0) {
    psVar2 = e;
    psVar1 = sexp_param_ref(ctx,e,(sexp_conflict)
                                  (((ctx->value).type.setters)->value).context.mark_stack[3].start);
    sexp_make_unblocking(psVar1,psVar2);
    psVar2 = e;
    psVar1 = sexp_param_ref(ctx,e,(sexp_conflict)
                                  (((ctx->value).type.setters)->value).context.mark_stack[3].end);
    sexp_make_unblocking(psVar1,psVar2);
    psVar2 = e;
    psVar1 = sexp_param_ref(ctx,e,(sexp_conflict)
                                  (((ctx->value).type.setters)->value).context.mark_stack[3].prev);
    sexp_make_unblocking(psVar1,psVar2);
  }
  psVar2 = (sexp_conflict)sexp_make_env_op(ctx,0,0);
  (psVar2->value).type.name = e;
  (ctx->value).type.cpl = psVar2;
  local_38 = psVar2;
  psVar1 = sexp_meta_env(ctx);
  sexp_set_parameter(ctx,psVar1,(((ctx->value).type.setters)->value).context.mark_stack[4].start,
                     psVar2);
  (ctx->value).context.saves = local_30.next;
  return local_38;
}

Assistant:

static sexp sexp_load_standard_params (sexp ctx, sexp e, int nonblocking) {
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  sexp_load_standard_ports(ctx, e, stdin, stdout, stderr, 0);
  if (nonblocking) {
    sexp_make_unblocking(ctx, sexp_param_ref(ctx, e, sexp_global(ctx, SEXP_G_CUR_IN_SYMBOL)));
    sexp_make_unblocking(ctx, sexp_param_ref(ctx, e, sexp_global(ctx, SEXP_G_CUR_OUT_SYMBOL)));
    sexp_make_unblocking(ctx, sexp_param_ref(ctx, e, sexp_global(ctx, SEXP_G_CUR_ERR_SYMBOL)));
  }
  res = sexp_make_env(ctx);
  sexp_env_parent(res) = e;
  sexp_context_env(ctx) = res;
  sexp_set_parameter(ctx, sexp_meta_env(ctx), sexp_global(ctx, SEXP_G_INTERACTION_ENV_SYMBOL), res);
  sexp_gc_release1(ctx);
  return res;
}